

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::PipelineResourceSignatureVkImpl::CopyStaticResources
          (PipelineResourceSignatureVkImpl *this,ShaderResourceCacheVk *DstResourceCache)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  ShaderResourceCacheVk *this_00;
  IDeviceObject *pIVar5;
  IDeviceObject *pIVar6;
  VulkanLogicalDevice *pLogicalDevice;
  DescriptorSet *this_01;
  DescriptorSet *this_02;
  PipelineResourceDesc *ResDesc;
  PipelineResourceAttribsType *pPVar7;
  Resource *pRVar8;
  Resource *pRVar9;
  RenderDeviceVkImpl *pRVar10;
  char (*Args_1) [56];
  char *Args_1_00;
  uint ArrayIndex;
  uint ResIndex;
  Uint32 CacheOffset;
  char (*in_stack_ffffffffffffff28) [3];
  string msg;
  String local_50;
  
  if (((this->m_VkDescrSetLayouts)._M_elems[0].m_VkObject != (VkDescriptorSetLayout_T *)0x0) &&
     (this_00 = (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                m_pStaticResCache, this_00 != (ShaderResourceCacheVk *)0x0)) {
    GetDescriptorSetIndex<(Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID)0>(this);
    this_01 = ShaderResourceCacheVk::GetDescriptorSet(this_00,0);
    this_02 = ShaderResourceCacheVk::GetDescriptorSet(DstResourceCache,0);
    uVar1 = (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
            m_ResourceOffsets._M_elems[1];
    uVar3 = *(uint *)&this_00->field_0x1c;
    uVar4 = *(uint *)&DstResourceCache->field_0x1c;
    Args_1 = (char (*) [56])(ulong)uVar4;
    for (ResIndex = (uint)(this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                          m_ResourceOffsets._M_elems[0]; ResIndex < uVar1; ResIndex = ResIndex + 1)
    {
      ResDesc = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceDesc
                          (&this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                           ResIndex);
      pPVar7 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceAttribs
                         (&this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                          ResIndex);
      if (ResDesc->VarType != SHADER_RESOURCE_VARIABLE_TYPE_STATIC) {
        FormatString<char[26],char[56]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"ResDesc.VarType == SHADER_RESOURCE_VARIABLE_TYPE_STATIC",Args_1);
        Args_1 = (char (*) [56])0x227;
        DebugAssertionFailed
                  ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p),
                   "CopyStaticResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                   ,0x227);
        std::__cxx11::string::~string((string *)&msg);
      }
      if ((ResDesc->ResourceType != SHADER_RESOURCE_TYPE_SAMPLER) || (-1 < *(long *)pPVar7)) {
        Args_1_00 = *(char (*) [56])0x0;
        while( true ) {
          ArrayIndex = (uint)Args_1_00;
          if (ResDesc->ArraySize <= ArrayIndex) break;
          pRVar8 = ShaderResourceCacheVk::DescriptorSet::GetResource
                             (this_01,(&pPVar7->SRBCacheOffset)[~uVar3 >> 0x1f] + ArrayIndex);
          pIVar5 = (pRVar8->pObject).m_pObject;
          if (pIVar5 == (IDeviceObject *)0x0) {
            if ((int)uVar4 < 0) {
              GetShaderResourcePrintName<Diligent::PipelineResourceDesc>
                        (&local_50,ResDesc,ArrayIndex);
              Args_1_00 = "\' in pipeline resource signature \'";
              FormatString<char[52],std::__cxx11::string,char[35],char_const*,char[3]>
                        (&msg,(Diligent *)"No resource is assigned to static shader variable \'",
                         (char (*) [52])&local_50,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "\' in pipeline resource signature \'",
                         (char (*) [35])
                         &(this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                          .m_Desc,(char **)"\'.",in_stack_ffffffffffffff28);
              std::__cxx11::string::~string((string *)&local_50);
              if (DebugMessageCallback != (undefined *)0x0) {
                Args_1_00 = (char *)0x0;
                (*(code *)DebugMessageCallback)
                          (2,CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p),0,0,0);
              }
              std::__cxx11::string::~string((string *)&msg);
            }
          }
          else {
            CacheOffset = (&pPVar7->SRBCacheOffset)[~uVar4 >> 0x1f] + ArrayIndex;
            pRVar9 = ShaderResourceCacheVk::DescriptorSet::GetResource(this_02,CacheOffset);
            if (pRVar8->Type != pRVar9->Type) {
              FormatString<char[26],char[39]>
                        (&msg,(Diligent *)"Debug expression failed:\n",
                         (char (*) [26])"SrcCachedRes.Type == DstCachedRes.Type",
                         (char (*) [39])Args_1_00);
              Args_1_00 = (char *)0x23a;
              DebugAssertionFailed
                        ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p),
                         "CopyStaticResources",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                         ,0x23a);
              std::__cxx11::string::~string((string *)&msg);
            }
            pIVar6 = (pRVar9->pObject).m_pObject;
            if (pIVar6 != pIVar5) {
              if (pIVar6 != (IDeviceObject *)0x0) {
                FormatString<char[111]>
                          (&msg,(char (*) [111])
                                "Static resource has already been initialized, and the new resource does not match previously assigned resource"
                          );
                DebugAssertionFailed
                          ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p),
                           "CopyStaticResources",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                           ,0x23f);
                std::__cxx11::string::~string((string *)&msg);
              }
              pRVar10 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                        ::GetDevice((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                     *)this);
              pLogicalDevice =
                   (pRVar10->m_LogicalVkDevice).
                   super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
              uVar2 = *(ushort *)pPVar7;
              RefCntAutoPtr<Diligent::IDeviceObject>::RefCntAutoPtr
                        ((RefCntAutoPtr<Diligent::IDeviceObject> *)&local_50,&pRVar8->pObject);
              msg._M_string_length = (size_type)local_50._M_dataplus._M_p;
              msg._M_dataplus._M_p._0_4_ = (uint)uVar2;
              local_50._M_dataplus._M_p = (pointer)0x0;
              msg.field_2._M_allocated_capacity = pRVar8->BufferBaseOffset;
              msg.field_2._8_8_ = pRVar8->BufferRangeSize;
              Args_1_00 = (char *)(ulong)CacheOffset;
              msg._M_dataplus._M_p._4_4_ = ArrayIndex;
              ShaderResourceCacheVk::SetResource
                        (DstResourceCache,pLogicalDevice,0,CacheOffset,(SetResourceInfo *)&msg);
              RefCntAutoPtr<Diligent::IDeviceObject>::Release
                        ((RefCntAutoPtr<Diligent::IDeviceObject> *)&msg._M_string_length);
              RefCntAutoPtr<Diligent::IDeviceObject>::Release
                        ((RefCntAutoPtr<Diligent::IDeviceObject> *)&local_50);
            }
          }
          Args_1 = (char (*) [56])Args_1_00;
          Args_1_00 = (char *)(ulong)(ArrayIndex + 1);
        }
      }
    }
    ShaderResourceCacheVk::DbgVerifyDynamicBuffersCounter(DstResourceCache);
  }
  return;
}

Assistant:

void PipelineResourceSignatureVkImpl::CopyStaticResources(ShaderResourceCacheVk& DstResourceCache) const
{
    if (!HasDescriptorSet(DESCRIPTOR_SET_ID_STATIC_MUTABLE) || m_pStaticResCache == nullptr)
        return;

    // SrcResourceCache contains only static resources.
    // In case of SRB, DstResourceCache contains static, mutable and dynamic resources.
    // In case of Signature, DstResourceCache contains only static resources.
    const auto& SrcResourceCache = *m_pStaticResCache;
    const auto  StaticSetIdx     = GetDescriptorSetIndex<DESCRIPTOR_SET_ID_STATIC_MUTABLE>();
    const auto& SrcDescrSet      = SrcResourceCache.GetDescriptorSet(StaticSetIdx);
    const auto& DstDescrSet      = const_cast<const ShaderResourceCacheVk&>(DstResourceCache).GetDescriptorSet(StaticSetIdx);
    const auto  ResIdxRange      = GetResourceIndexRange(SHADER_RESOURCE_VARIABLE_TYPE_STATIC);
    const auto  SrcCacheType     = SrcResourceCache.GetContentType();
    const auto  DstCacheType     = DstResourceCache.GetContentType();

    for (Uint32 r = ResIdxRange.first; r < ResIdxRange.second; ++r)
    {
        const auto& ResDesc = GetResourceDesc(r);
        const auto& Attr    = GetResourceAttribs(r);
        VERIFY_EXPR(ResDesc.VarType == SHADER_RESOURCE_VARIABLE_TYPE_STATIC);

        if (ResDesc.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER && Attr.IsImmutableSamplerAssigned())
            continue; // Skip immutable separate samplers

        for (Uint32 ArrInd = 0; ArrInd < ResDesc.ArraySize; ++ArrInd)
        {
            const auto     SrcCacheOffset = Attr.CacheOffset(SrcCacheType) + ArrInd;
            const auto&    SrcCachedRes   = SrcDescrSet.GetResource(SrcCacheOffset);
            IDeviceObject* pObject        = SrcCachedRes.pObject;
            if (pObject == nullptr)
            {
                if (DstCacheType == ResourceCacheContentType::SRB)
                    LOG_ERROR_MESSAGE("No resource is assigned to static shader variable '", GetShaderResourcePrintName(ResDesc, ArrInd), "' in pipeline resource signature '", m_Desc.Name, "'.");
                continue;
            }

            const auto  DstCacheOffset = Attr.CacheOffset(DstCacheType) + ArrInd;
            const auto& DstCachedRes   = DstDescrSet.GetResource(DstCacheOffset);
            VERIFY_EXPR(SrcCachedRes.Type == DstCachedRes.Type);

            const IDeviceObject* pCachedResource = DstCachedRes.pObject;
            if (pCachedResource != pObject)
            {
                DEV_CHECK_ERR(pCachedResource == nullptr, "Static resource has already been initialized, and the new resource does not match previously assigned resource");
                DstResourceCache.SetResource(&GetDevice()->GetLogicalDevice(),
                                             StaticSetIdx,
                                             DstCacheOffset,
                                             {
                                                 Attr.BindingIndex,
                                                 ArrInd,
                                                 RefCntAutoPtr<IDeviceObject>{SrcCachedRes.pObject},
                                                 SrcCachedRes.BufferBaseOffset,
                                                 SrcCachedRes.BufferRangeSize //
                                             });
            }
        }
    }

#ifdef DILIGENT_DEBUG
    DstResourceCache.DbgVerifyDynamicBuffersCounter();
#endif
}